

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_writeValueInteger(qpTestLog *log,deInt64 value)

{
  deBool dVar1;
  char local_68 [8];
  char tmpString [64];
  deInt64 value_local;
  qpTestLog *log_local;
  
  int64ToString(value,local_68);
  deMutex_lock(log->lock);
  dVar1 = qpXmlWriter_writeStringElement(log->writer,"Value",local_68);
  if (dVar1 != 0) {
    deMutex_unlock(log->lock);
  }
  else {
    qpPrintf("qpTestLog_writeSampleValue(): Writing XML failed\n");
    deMutex_unlock(log->lock);
  }
  log_local._4_4_ = (uint)(dVar1 != 0);
  return log_local._4_4_;
}

Assistant:

deBool qpTestLog_writeValueInteger (qpTestLog* log, deInt64 value)
{
	char tmpString[64];
	int64ToString(value, tmpString);

	deMutex_lock(log->lock);

	DE_ASSERT(ContainerStack_getTop(&log->containerStack) == CONTAINERTYPE_SAMPLE);

	if (!qpXmlWriter_writeStringElement(log->writer, "Value", &tmpString[0]))
	{
		qpPrintf("qpTestLog_writeSampleValue(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}